

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_subquery_expression.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundSubqueryExpression::Copy(BoundSubqueryExpression *this)

{
  SerializationException *this_00;
  allocator local_39;
  string local_38;
  
  this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Cannot copy BoundSubqueryExpression",&local_39);
  SerializationException::SerializationException(this_00,&local_38);
  __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<Expression> BoundSubqueryExpression::Copy() const {
	throw SerializationException("Cannot copy BoundSubqueryExpression");
}